

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent-client.c
# Opt level: O0

_Bool agent_try_read(agent_pending_query *conn)

{
  uint32_t uVar1;
  int iVar2;
  ssize_t sVar3;
  char *pcVar4;
  int ret;
  agent_pending_query *conn_local;
  
  sVar3 = read(conn->fd,conn->retbuf + conn->retlen,(long)(conn->retsize - conn->retlen));
  if ((int)sVar3 < 1) {
    if (conn->retbuf != conn->sizebuf) {
      safefree(conn->retbuf);
    }
    conn->retbuf = (char *)0x0;
    conn->retlen = 0;
    conn_local._7_1_ = true;
  }
  else {
    conn->retlen = (int)sVar3 + conn->retlen;
    if ((conn->retsize == 4) && (conn->retlen == 4)) {
      uVar1 = GET_32BIT_MSB_FIRST(conn->retbuf);
      iVar2 = toint(uVar1 + 4);
      conn->retsize = iVar2;
      if (conn->retsize < 1) {
        conn->retbuf = (char *)0x0;
        conn->retlen = 0;
        return true;
      }
      if (conn->retbuf != conn->sizebuf) {
        __assert_fail("conn->retbuf == conn->sizebuf",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/agent-client.c"
                      ,0x52,"_Bool agent_try_read(agent_pending_query *)");
      }
      pcVar4 = (char *)safemalloc((long)conn->retsize,1,0);
      conn->retbuf = pcVar4;
      *(undefined4 *)conn->retbuf = *(undefined4 *)conn->sizebuf;
    }
    if (conn->retlen < conn->retsize) {
      conn_local._7_1_ = false;
    }
    else {
      conn_local._7_1_ = true;
    }
  }
  return conn_local._7_1_;
}

Assistant:

static bool agent_try_read(agent_pending_query *conn)
{
    int ret;

    ret = read(conn->fd, conn->retbuf+conn->retlen,
               conn->retsize-conn->retlen);
    if (ret <= 0) {
        if (conn->retbuf != conn->sizebuf) sfree(conn->retbuf);
        conn->retbuf = NULL;
        conn->retlen = 0;
        return true;
    }
    conn->retlen += ret;
    if (conn->retsize == 4 && conn->retlen == 4) {
        conn->retsize = toint(GET_32BIT_MSB_FIRST(conn->retbuf) + 4);
        if (conn->retsize <= 0) {
            conn->retbuf = NULL;
            conn->retlen = 0;
            return true;                 /* way too large */
        }
        assert(conn->retbuf == conn->sizebuf);
        conn->retbuf = snewn(conn->retsize, char);
        memcpy(conn->retbuf, conn->sizebuf, 4);
    }

    if (conn->retlen < conn->retsize)
        return false;                  /* more data to come */

    return true;
}